

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void __thiscall
Gudhi::ripser::
Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
::append_column(Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
                *this)

{
  iterator __position;
  unsigned_long local_8;
  
  local_8 = (long)(this->entries).
                  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->entries).
                  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
  __position._M_current =
       (this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->bounds,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    (this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }